

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O2

void __thiscall deqp::gls::RandomShaderProgram::shadeFragments(RandomShaderProgram *this)

{
  FragmentShadingContext *in_RCX;
  int in_EDX;
  FragmentPacket *in_RSI;
  
  shadeFragments((RandomShaderProgram *)&this[-1].m_samplerCubeMap,in_RSI,in_EDX,in_RCX);
  return;
}

Assistant:

void RandomShaderProgram::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const rsg::ExecConstValueAccess	fragColorAccess	= m_execCtx.getValue(m_fragColorVar);
	int								packetOffset	= 0;

	DE_STATIC_ASSERT(rsg::EXEC_VEC_WIDTH % rr::NUM_FRAGMENTS_PER_PACKET == 0);

	while (packetOffset < numPackets)
	{
		const int	numPacketsToExecute	= de::min(numPackets-packetOffset, (int)rsg::EXEC_VEC_WIDTH / (int)rr::NUM_FRAGMENTS_PER_PACKET);

		// Interpolate varyings.
		for (int varNdx = 0; varNdx < (int)m_fragmentShader.getInputs().size(); ++varNdx)
		{
			const rsg::Variable*		var				= m_fragmentShader.getInputs()[varNdx]->getVariable();
			const rsg::VariableType&	varType			= var->getType();
			const int					numComponents	= varType.getNumElements();
			rsg::ExecValueAccess		access			= m_execCtx.getValue(var);

			DE_ASSERT(varType.isFloatOrVec() && de::inRange(numComponents, 1, 4));

			for (int packetNdx = 0; packetNdx < numPacketsToExecute; packetNdx++)
			{
				const rr::FragmentPacket&	packet		= packets[packetOffset+packetNdx];

				for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
				{
					const tcu::Vec4		varValue	= rr::readVarying<float>(packet, context, varNdx, fragNdx);
					const int			dstNdx		= packetNdx*rr::NUM_FRAGMENTS_PER_PACKET + fragNdx;

											access.component(0).asFloat(dstNdx) = varValue[0];
					if (numComponents >= 2)	access.component(1).asFloat(dstNdx) = varValue[1];
					if (numComponents >= 3)	access.component(2).asFloat(dstNdx) = varValue[2];
					if (numComponents >= 4)	access.component(3).asFloat(dstNdx) = varValue[3];
				}
			}
		}

		m_fragmentShader.execute(m_execCtx);

		// Store color
		for (int packetNdx = 0; packetNdx < numPacketsToExecute; packetNdx++)
		{
			for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
			{
				const int		srcNdx	= packetNdx*rr::NUM_FRAGMENTS_PER_PACKET + fragNdx;
				const tcu::Vec4 color	(fragColorAccess.component(0).asFloat(srcNdx),
										 fragColorAccess.component(1).asFloat(srcNdx),
										 fragColorAccess.component(2).asFloat(srcNdx),
										 fragColorAccess.component(3).asFloat(srcNdx));

				rr::writeFragmentOutput(context, packetOffset+packetNdx, fragNdx, 0, color);
			}
		}

		packetOffset += numPacketsToExecute;
	}
}